

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_ps.c
# Opt level: O3

MPP_RET h265e_set_sps(H265eCtx *ctx,H265eSps *sps,H265eVps *vps)

{
  MppFrameFormat MVar1;
  RK_U32 RVar2;
  MppFrameColorPrimaries MVar3;
  MppFrameColorTransferCharacteristic MVar4;
  MppFrameColorSpace MVar5;
  MppEncCfgSet *pMVar6;
  undefined1 auVar7 [16];
  byte bVar8;
  RockchipSocType RVar9;
  uint uVar10;
  MppEncCpbInfo *pMVar11;
  RK_U32 *pRVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  RK_S32 RVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  RK_U32 *tmp;
  RK_U8 convertToBit [129];
  RK_U32 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  byte local_b8 [136];
  long lVar27;
  
  pMVar6 = ctx->cfg;
  MVar1 = (pMVar6->prep).format;
  local_c8._0_4_ = (pMVar6->rc).fps_out_num;
  local_c8._4_4_ = (pMVar6->rc).fps_out_denom;
  uStack_c0 = 0;
  pMVar11 = mpp_enc_ref_cfg_get_cpb_info(pMVar6->ref_cfg);
  local_d0 = sps->zscan2raster;
  memset(local_b8,0xff,0x81);
  bVar8 = 0;
  uVar22 = 4;
  do {
    local_b8[uVar22] = bVar8;
    bVar8 = bVar8 + 1;
    bVar24 = uVar22 < 0x41;
    uVar22 = uVar22 * 2;
  } while (bVar24);
  iVar20 = (pMVar6->codec).field_1.h265.max_cu_size;
  bVar8 = local_b8[iVar20];
  RVar9 = mpp_get_soc_type();
  uVar22 = 0;
  do {
    uVar21 = uVar22;
    uVar22 = uVar21 + 1;
  } while ((uint)(1 << ((char)uVar21 + 2U & 0x1f)) <
           (uint)((pMVar6->codec).field_1.h265.max_cu_size >> (bVar8 & 0x1f)));
  uVar16 = iVar20 >> (bVar8 - 1 & 0x1f);
  uVar23 = (bVar8 + uVar22) - 1;
  init_zscan2raster(bVar8 + uVar22,1,0,&local_d0);
  uVar15 = (pMVar6->codec).field_1.h264.hw_cfg.hw_poc_type;
  uVar10 = uVar15 / (uVar15 >> ((byte)uVar23 & 0x1f));
  uVar10 = uVar10 * uVar10;
  if (uVar10 != 0) {
    uVar13 = 0;
    do {
      sps->raster2zscan[sps->zscan2raster[uVar13]] = (RK_U32)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar10);
    uVar15 = (pMVar6->codec).field_1.h264.hw_cfg.hw_poc_type;
  }
  init_raster2pelxy(uVar15,bVar8 + uVar22,sps->raster2pelx,sps->raster2pely);
  (sps->m_conformanceWindow).m_enabledFlag = 0;
  (sps->m_conformanceWindow).m_winLeftOffset = 0;
  (sps->m_conformanceWindow).m_winRightOffset = 0;
  (sps->m_conformanceWindow).m_winTopOffset = 0;
  (sps->m_conformanceWindow).m_winBottomOffset = 0;
  uVar15 = (pMVar6->prep).width;
  uVar10 = uVar15 % uVar16;
  iVar20 = 0;
  if (uVar10 != 0) {
    iVar20 = uVar16 - uVar10;
    (sps->m_conformanceWindow).m_enabledFlag = 1;
    (sps->m_conformanceWindow).m_winRightOffset = iVar20;
  }
  uVar10 = (pMVar6->prep).height;
  RVar18 = 0;
  uVar14 = uVar10 % uVar16;
  iVar17 = 0;
  if (uVar14 != 0) {
    iVar17 = uVar16 - uVar14;
    (sps->m_conformanceWindow).m_enabledFlag = 1;
    (sps->m_conformanceWindow).m_winBottomOffset = iVar17;
  }
  sps->m_SPSId = 0;
  sps->m_VPSId = 0;
  sps->m_chromaFormatIdc = (uint)(MVar1 != MPP_FMT_YUV400);
  uVar16 = vps->m_maxLayers;
  sps->m_maxTLayers = uVar16;
  sps->m_picWidthInLumaSamples = iVar20 + uVar15;
  sps->m_picHeightInLumaSamples = iVar17 + uVar10;
  uVar15 = (pMVar6->codec).field_1.h264.hw_cfg.hw_poc_type;
  sps->m_maxCUSize = uVar15;
  sps->m_maxCUDepth = uVar23;
  sps->m_addCUDepth = uVar22;
  (sps->m_RPSList).m_numberOfReferencePictureSets = 0;
  (sps->m_RPSList).m_referencePictureSets = (H265eReferencePictureSet *)0x0;
  uVar22 = uVar23 - uVar22;
  uVar15 = uVar15 >> ((byte)uVar22 & 0x1f);
  if (1 < (int)uVar15) {
    RVar18 = 0;
    do {
      RVar18 = RVar18 + 1;
      bVar24 = 3 < uVar15;
      uVar15 = uVar15 >> 1;
    } while (bVar24);
  }
  sps->m_log2MinCodingBlockSize = RVar18;
  sps->m_log2DiffMaxMinCodingBlockSize = uVar22;
  sps->m_pcmLog2MaxSize = 5;
  sps->m_pcmLog2MinSize = 3;
  sps->m_bLongTermRefsPresent = 0;
  sps->m_quadtreeTULog2MaxSize = (RVar9 - ROCKCHIP_SOC_RK3576 < 2) + 1 + (uint)bVar8;
  sps->m_quadtreeTULog2MinSize = 2;
  sps->m_quadtreeTUMaxDepthInter = 1;
  sps->m_quadtreeTUMaxDepthIntra = 1;
  sps->m_usePCM = 0;
  sps->m_useLossless = 0;
  auVar7 = _DAT_00277a10;
  uVar13 = (ulong)uVar22;
  if (bVar8 != 1) {
    RVar2 = (pMVar6->codec).field_1.h264.hw_cfg.hw_split_out;
    lVar27 = uVar13 - 1;
    auVar25._8_4_ = (int)lVar27;
    auVar25._0_8_ = lVar27;
    auVar25._12_4_ = (int)((ulong)lVar27 >> 0x20);
    uVar19 = 0;
    auVar25 = auVar25 ^ _DAT_00277a10;
    auVar26 = _DAT_002788f0;
    auVar28 = _DAT_00277a00;
    do {
      auVar30 = auVar28 ^ auVar7;
      iVar20 = auVar25._4_4_;
      if ((bool)(~(auVar30._4_4_ == iVar20 && auVar25._0_4_ < auVar30._0_4_ ||
                  iVar20 < auVar30._4_4_) & 1)) {
        sps->m_iAMPAcc[uVar19] = RVar2;
      }
      if ((auVar30._12_4_ != auVar25._12_4_ || auVar30._8_4_ <= auVar25._8_4_) &&
          auVar30._12_4_ <= auVar25._12_4_) {
        sps->m_iAMPAcc[uVar19 + 1] = RVar2;
      }
      auVar30 = auVar26 ^ auVar7;
      iVar17 = auVar30._4_4_;
      if (iVar17 <= iVar20 && (iVar17 != iVar20 || auVar30._0_4_ <= auVar25._0_4_)) {
        sps->m_iAMPAcc[uVar19 + 2] = RVar2;
        sps->m_iAMPAcc[uVar19 + 3] = RVar2;
      }
      uVar19 = uVar19 + 4;
      lVar27 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 4;
      auVar28._8_8_ = lVar27 + 4;
      lVar27 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 4;
      auVar26._8_8_ = lVar27 + 4;
    } while ((uVar13 + 3 & 0xfffffffffffffffc) != uVar19);
  }
  RVar2 = (pMVar6->codec).field_1.h264.hw_cfg.hw_split_out;
  sps->m_useAMP = RVar2;
  auVar28 = _DAT_002788f0;
  auVar26 = _DAT_00277a10;
  auVar7 = _DAT_00277a00;
  if (uVar22 < uVar23) {
    auVar30._4_4_ = 0;
    auVar30._0_4_ = uVar21;
    auVar30._8_4_ = uVar21;
    auVar30._12_4_ = 0;
    uVar19 = 0;
    auVar30 = auVar30 ^ _DAT_00277a10;
    do {
      auVar29._8_4_ = (int)uVar19;
      auVar29._0_8_ = uVar19;
      auVar29._12_4_ = (int)(uVar19 >> 0x20);
      auVar25 = (auVar29 | auVar7) ^ auVar26;
      iVar20 = auVar30._4_4_;
      if ((bool)(~(auVar25._4_4_ == iVar20 && auVar30._0_4_ < auVar25._0_4_ ||
                  iVar20 < auVar25._4_4_) & 1)) {
        sps->m_iAMPAcc[uVar13 + uVar19] = RVar2;
      }
      if ((auVar25._12_4_ != auVar30._12_4_ || auVar25._8_4_ <= auVar30._8_4_) &&
          auVar25._12_4_ <= auVar30._12_4_) {
        sps->m_iAMPAcc[uVar13 + uVar19 + 1] = RVar2;
      }
      auVar25 = (auVar29 | auVar28) ^ auVar26;
      iVar17 = auVar25._4_4_;
      if (iVar17 <= iVar20 && (iVar17 != iVar20 || auVar25._0_4_ <= auVar30._0_4_)) {
        sps->m_iAMPAcc[uVar13 + uVar19 + 2] = RVar2;
        sps->m_iAMPAcc[uVar13 + uVar19 + 3] = RVar2;
      }
      uVar19 = uVar19 + 4;
    } while (((ulong)uVar21 + 4 & 0xfffffffffffffffc) != uVar19);
  }
  sps->m_bitDepthY = 8;
  sps->m_bitDepthC = 8;
  sps->m_qpBDOffsetY = 0;
  sps->m_qpBDOffsetC = 0;
  sps->m_bUseSAO = (pMVar6->codec).field_1.h264.entropy_coding_mode;
  sps->m_bTemporalIdNestingFlag = 1;
  if ((ulong)uVar16 != 0) {
    uVar13 = 0;
    do {
      sps->m_maxDecPicBuffering[uVar13] = vps->m_maxDecPicBuffering[uVar13];
      sps->m_numReorderPics[uVar13] = vps->m_numReorderPics[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar16 != uVar13);
  }
  sps->m_scalingListEnabledFlag =
       (uint)((pMVar6->codec).field_1.h265.trans_cfg.defalut_ScalingList_enable != 0);
  sps->m_pcmBitDepthLuma = 8;
  sps->m_pcmBitDepthChroma = 8;
  sps->m_bPCMFilterDisableFlag = 0;
  sps->m_bitsForPOC = 0x10;
  sps->m_numLongTermRefPicSPS = 0;
  sps->m_maxTrSize = 0x20;
  sps->m_bLongTermRefsPresent = 0;
  sps->m_TMVPFlagsPresent = (pMVar6->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4;
  sps->m_useStrongIntraSmoothing =
       (pMVar6->codec).field_1.h265.cu_cfg.strong_intra_smoothing_enabled_flag;
  if (pMVar11->max_lt_cnt == 0) {
    if (pMVar11->max_st_tid == 0) goto LAB_001d0fc8;
    pRVar12 = &sps->m_TMVPFlagsPresent;
  }
  else {
    pRVar12 = &(pMVar6->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4;
    sps->m_numLongTermRefPicSPS = pMVar11->max_lt_cnt;
    sps->m_bLongTermRefsPresent = 1;
    sps->m_TMVPFlagsPresent = 0;
  }
  *pRVar12 = 0;
LAB_001d0fc8:
  if ((pMVar6->rc).drop_mode == MPP_ENC_RC_DROP_FRM_PSKIP) {
    (pMVar6->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4 = 0;
    sps->m_TMVPFlagsPresent = 0;
    (pMVar6->codec).field_1.h264.entropy_coding_mode = 0;
    sps->m_bUseSAO = 0;
  }
  sps->m_ptl = &vps->m_ptl;
  sps->m_vuiParametersPresentFlag = 1;
  (sps->vui).m_aspectRatioInfoPresentFlag = 0;
  (sps->vui).m_aspectRatioIdc = 0;
  (sps->vui).m_sarWidth = 0;
  (sps->vui).m_sarHeight = 0;
  (sps->vui).m_sarHeight = 0;
  (sps->vui).m_overscanInfoPresentFlag = 0;
  (sps->vui).m_overscanAppropriateFlag = 0;
  (sps->vui).m_videoSignalTypePresentFlag = 0;
  (sps->vui).m_videoFormat = 5;
  if ((pMVar6->prep).range == MPP_FRAME_RANGE_JPEG) {
    (sps->vui).m_videoFullRangeFlag = 1;
    (sps->vui).m_videoSignalTypePresentFlag = 1;
  }
  MVar3 = (pMVar6->prep).colorprim;
  MVar4 = (pMVar6->prep).colortrc;
  if (((MVar3 < MPP_FRAME_PRI_NB && MVar3 != MPP_FRAME_PRI_UNSPECIFIED) ||
      (MVar4 < MPP_FRAME_TRC_NB && MVar4 != MPP_FRAME_TRC_UNSPECIFIED)) ||
     (MVar5 = (pMVar6->prep).color, MVar5 != MPP_FRAME_SPC_UNSPECIFIED && MVar5 < MPP_FRAME_SPC_NB))
  {
    (sps->vui).m_videoSignalTypePresentFlag = 1;
    (sps->vui).m_colourDescriptionPresentFlag = 1;
    (sps->vui).m_colourPrimaries = MVar3;
    (sps->vui).m_transferCharacteristics = MVar4;
    (sps->vui).m_matrixCoefficients = (pMVar6->prep).color;
  }
  (sps->vui).m_chromaLocInfoPresentFlag = 0;
  (sps->vui).m_chromaSampleLocTypeTopField = 0;
  (sps->vui).m_chromaSampleLocTypeBottomField = 0;
  (sps->vui).m_neutralChromaIndicationFlag = 0;
  (sps->vui).m_fieldSeqFlag = 0;
  (sps->vui).m_frameFieldInfoPresentFlag = 0;
  (sps->vui).m_hrdParametersPresentFlag = 0;
  (sps->vui).m_bitstreamRestrictionFlag = 0;
  (sps->vui).m_tilesFixedStructureFlag = 0;
  (sps->vui).m_motionVectorsOverPicBoundariesFlag = 1;
  (sps->vui).m_restrictedRefPicListsFlag = 1;
  (sps->vui).m_minSpatialSegmentationIdc = 0;
  (sps->vui).m_maxBytesPerPicDenom = 2;
  (sps->vui).m_maxBitsPerMinCuDenom = 1;
  (sps->vui).m_log2MaxMvLengthHorizontal = 0xf;
  (sps->vui).m_log2MaxMvLengthVertical = 0xf;
  iVar20 = (pMVar6->codec).field_1.h265.vui.vui_aspect_ratio;
  if (iVar20 != 0) {
    (sps->vui).m_aspectRatioInfoPresentFlag = 1;
    (sps->vui).m_aspectRatioIdc = iVar20;
  }
  (sps->vui).m_timingInfo.m_timingInfoPresentFlag = 1;
  (sps->vui).m_timingInfo.m_numUnitsInTick = local_c8._4_4_;
  (sps->vui).m_timingInfo.m_timeScale = (undefined4)local_c8;
  sps->m_maxLatencyIncrease[0] = 0;
  sps->m_maxLatencyIncrease[1] = 0;
  sps->m_maxLatencyIncrease[2] = 0;
  sps->m_maxLatencyIncrease[3] = 0;
  sps->m_maxLatencyIncrease[3] = 0;
  sps->m_maxLatencyIncrease[4] = 0;
  sps->m_maxLatencyIncrease[5] = 0;
  sps->m_maxLatencyIncrease[6] = 0;
  memset(sps->m_ltRefPicPocLsbSps,0,0x108);
  return MPP_OK;
}

Assistant:

MPP_RET h265e_set_sps(H265eCtx *ctx, H265eSps *sps, H265eVps *vps)
{
    RK_U32 i, c;
    MppEncH265Cfg *codec = &ctx->cfg->codec.h265;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    MppEncRcCfg *rc = &ctx->cfg->rc;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncH265VuiCfg *vui = &codec->vui;
    MppFrameFormat fmt = prep->format;
    RK_S32 i_timebase_num = rc->fps_out_denom;
    RK_S32 i_timebase_den = rc->fps_out_num;
    RK_U8  convertToBit[MAX_CU_SIZE + 1];
    RK_U32 maxCUDepth, minCUDepth, addCUDepth;
    RK_S32 pad[2] = {0};
    RK_S32 minCUSize, log2MinCUSize;
    RK_S32 tuQTMinLog2Size = 2, tuQTMaxLog2Size;
    MppEncCpbInfo *cpb_info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
    RockchipSocType soc_type;
    RK_U32 *tmp = &sps->zscan2raster[0];

    memset(convertToBit, -1, sizeof(convertToBit));
    c = 0;
    for (i = 4; i <= MAX_CU_SIZE; i *= 2) {
        convertToBit[i] = c;
        c++;
    }

    maxCUDepth = (uint32_t)convertToBit[codec->max_cu_size];

    minCUDepth = (codec->max_cu_size >> (maxCUDepth - 1));

    tuQTMaxLog2Size = convertToBit[codec->max_cu_size] + 2 - 1;
    soc_type = mpp_get_soc_type();
    if (soc_type == ROCKCHIP_SOC_RK3576 || soc_type == ROCKCHIP_SOC_RV1126B) {
        tuQTMaxLog2Size = tuQTMaxLog2Size + 1;
    }

    addCUDepth = 0;
    while ((RK_U32)(codec->max_cu_size >> maxCUDepth) > (1u << (tuQTMinLog2Size + addCUDepth))) {
        addCUDepth++;
    }

    maxCUDepth += addCUDepth;
    addCUDepth++;
    init_zscan2raster(maxCUDepth + 1, 1, 0, &tmp );
    init_raster2zscan(codec->max_cu_size, maxCUDepth + 1, &sps->raster2zscan[0], &sps->zscan2raster[0]);
    init_raster2pelxy(codec->max_cu_size, maxCUDepth + 1, &sps->raster2pelx[0], &sps->raster2pely[0]);

    memset(&sps->m_conformanceWindow, 0, sizeof(H265eCropInfo));
    if ((prep->width % minCUDepth) != 0) {
        RK_U32 padsize = 0;
        RK_U32 rem = prep->width % minCUDepth;
        padsize = minCUDepth - rem;
        pad[0] = padsize; //pad width

        /* set the confirmation window offsets  */
        sps->m_conformanceWindow.m_enabledFlag = 1;
        sps->m_conformanceWindow.m_winRightOffset = pad[0];
    }

    if ((prep->height % minCUDepth) != 0) {
        RK_U32 padsize = 0;
        RK_U32 rem = prep->height % minCUDepth;
        padsize = minCUDepth - rem;
        pad[1] = padsize; //pad height

        /* set the confirmation window offsets  */
        sps->m_conformanceWindow.m_enabledFlag = 1;
        sps->m_conformanceWindow.m_winBottomOffset = pad[1];
    }
    // pad[0] = p->sourceWidth - p->oldSourceWidth;
    // pad[1] = p->sourceHeight - p->oldSourceHeight;

    sps->m_SPSId = 0;
    sps->m_VPSId = 0;
    sps->m_chromaFormatIdc = (fmt == MPP_FMT_YUV400) ? H265_CHROMA_400 : H265_CHROMA_420;
    sps->m_maxTLayers = vps->m_maxLayers;
    sps->m_picWidthInLumaSamples = prep->width + pad[0];
    sps->m_picHeightInLumaSamples = prep->height + pad[1];
    sps->m_log2MinCodingBlockSize = 0;
    sps->m_log2DiffMaxMinCodingBlockSize = 0 ;
    sps->m_maxCUSize = codec->max_cu_size;
    sps->m_maxCUDepth = maxCUDepth;
    sps->m_addCUDepth = addCUDepth;
    sps->m_RPSList.m_numberOfReferencePictureSets = 0;
    sps->m_RPSList.m_referencePictureSets = NULL;

    minCUSize = sps->m_maxCUSize >> (sps->m_maxCUDepth - addCUDepth);
    log2MinCUSize = 0;
    while (minCUSize > 1) {
        minCUSize >>= 1;
        log2MinCUSize++;
    }
    sps->m_log2MinCodingBlockSize = log2MinCUSize;
    sps->m_log2DiffMaxMinCodingBlockSize = sps->m_maxCUDepth - addCUDepth;

    sps->m_pcmLog2MaxSize = 5;
    sps->m_usePCM = 0;
    sps->m_pcmLog2MinSize = 3;


    sps->m_bLongTermRefsPresent = 0;
    sps->m_quadtreeTULog2MaxSize =  tuQTMaxLog2Size;
    sps->m_quadtreeTULog2MinSize = tuQTMinLog2Size;
    sps->m_quadtreeTUMaxDepthInter = 1;     //tuQTMaxInterDepth
    sps->m_quadtreeTUMaxDepthIntra = 1;     //tuQTMaxIntraDepth
    sps->m_useLossless = 0;

    for (i = 0; i < (maxCUDepth - addCUDepth); i++) {
        sps->m_iAMPAcc[i] = codec->amp_enable;
    }
    sps->m_useAMP = codec->amp_enable;
    for (i = maxCUDepth - addCUDepth; i < maxCUDepth; i++) {
        sps->m_iAMPAcc[i] = codec->amp_enable;
    }

    sps->m_bitDepthY = 8;
    sps->m_bitDepthC = 8;
    sps->m_qpBDOffsetY = 0;
    sps->m_qpBDOffsetC = 0;

    sps->m_bUseSAO = codec->sao_enable;
    sps->m_bTemporalIdNestingFlag = 1;

    for (i = 0; i < sps->m_maxTLayers; i++) {
        sps->m_maxDecPicBuffering[i] = vps->m_maxDecPicBuffering[i];
        sps->m_numReorderPics[i] = vps->m_numReorderPics[i];
    }

    sps->m_pcmBitDepthLuma = 8;
    sps->m_pcmBitDepthChroma = 8;

    sps->m_bPCMFilterDisableFlag = 0;
    sps->m_scalingListEnabledFlag = codec->trans_cfg.defalut_ScalingList_enable == 0 ? 0 : 1;

    sps->m_bitsForPOC = 16;
    sps->m_numLongTermRefPicSPS = 0;
    sps->m_maxTrSize = 32;
    sps->m_bLongTermRefsPresent = 0;
    sps->m_TMVPFlagsPresent = codec->tmvp_enable;
    sps->m_useStrongIntraSmoothing = codec->cu_cfg.strong_intra_smoothing_enabled_flag;
    if (cpb_info->max_lt_cnt) {
        sps->m_numLongTermRefPicSPS = cpb_info->max_lt_cnt;
        sps->m_bLongTermRefsPresent = 1;
        sps->m_TMVPFlagsPresent = 0;
        codec->tmvp_enable = 0;
    } else if (cpb_info->max_st_tid) {
        sps->m_TMVPFlagsPresent = 0;
    }

    if (rc->drop_mode == MPP_ENC_RC_DROP_FRM_PSKIP) {
        codec->tmvp_enable = 0;
        sps->m_TMVPFlagsPresent = 0;
        codec->sao_enable = 0;
        sps->m_bUseSAO = 0;
    }

    sps->m_ptl = &vps->m_ptl;
    sps->m_vuiParametersPresentFlag = 1;
    if (sps->m_vuiParametersPresentFlag) {
        sps->vui.m_aspectRatioInfoPresentFlag = 0;
        sps->vui.m_aspectRatioIdc = 0;
        sps->vui.m_sarWidth = 0;
        sps->vui.m_sarHeight = 0;
        sps->vui.m_overscanInfoPresentFlag = 0;
        sps->vui.m_overscanAppropriateFlag = 0;
        sps->vui.m_videoSignalTypePresentFlag = 0;
        sps->vui.m_videoFormat = MPP_FRAME_VIDEO_FMT_UNSPECIFIED;
        if (prep->range == MPP_FRAME_RANGE_JPEG) {
            sps->vui.m_videoFullRangeFlag = 1;
            sps->vui.m_videoSignalTypePresentFlag = 1;
        }

        if ((prep->colorprim <= MPP_FRAME_PRI_JEDEC_P22 &&
             prep->colorprim != MPP_FRAME_PRI_UNSPECIFIED) ||
            (prep->colortrc <= MPP_FRAME_TRC_ARIB_STD_B67 &&
             prep->colortrc != MPP_FRAME_TRC_UNSPECIFIED) ||
            (prep->color <= MPP_FRAME_SPC_ICTCP &&
             prep->color != MPP_FRAME_SPC_UNSPECIFIED)) {
            sps->vui.m_videoSignalTypePresentFlag = 1;
            sps->vui.m_colourDescriptionPresentFlag = 1;
            sps->vui.m_colourPrimaries = prep->colorprim;
            sps->vui.m_transferCharacteristics = prep->colortrc;
            sps->vui.m_matrixCoefficients = prep->color;
        }

        sps->vui.m_chromaLocInfoPresentFlag = 0;
        sps->vui.m_chromaSampleLocTypeTopField = 0;
        sps->vui.m_chromaSampleLocTypeBottomField = 0;
        sps->vui.m_neutralChromaIndicationFlag = 0;
        sps->vui.m_fieldSeqFlag = 0;
        sps->vui.m_frameFieldInfoPresentFlag = 0;
        sps->vui.m_hrdParametersPresentFlag = 0;
        sps->vui.m_bitstreamRestrictionFlag = 0;
        sps->vui.m_tilesFixedStructureFlag = 0;
        sps->vui.m_motionVectorsOverPicBoundariesFlag = 1;
        sps->vui.m_restrictedRefPicListsFlag = 1;
        sps->vui.m_minSpatialSegmentationIdc = 0;
        sps->vui.m_maxBytesPerPicDenom = 2;
        sps->vui.m_maxBitsPerMinCuDenom = 1;
        sps->vui.m_log2MaxMvLengthHorizontal = 15;
        sps->vui.m_log2MaxMvLengthVertical = 15;
        if (vui->vui_aspect_ratio) {
            sps->vui.m_aspectRatioInfoPresentFlag = !!vui->vui_aspect_ratio;
            sps->vui.m_aspectRatioIdc = vui->vui_aspect_ratio;
        }
        sps->vui.m_timingInfo.m_timingInfoPresentFlag = 1;
        sps->vui.m_timingInfo.m_numUnitsInTick = i_timebase_num;
        sps->vui.m_timingInfo.m_timeScale = i_timebase_den;
    }



    for (i = 0; i < MAX_SUB_LAYERS; i++) {
        sps->m_maxLatencyIncrease[i] = 0;
    }
    //  sps->m_scalingList = NULL;
    memset(sps->m_ltRefPicPocLsbSps, 0, sizeof(sps->m_ltRefPicPocLsbSps));
    memset(sps->m_usedByCurrPicLtSPSFlag, 0, sizeof(sps->m_usedByCurrPicLtSPSFlag));
    return 0;
}